

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

void __thiscall
VertexClustering::initClusters
          (VertexClustering *this,vector<VCEdge,_std::allocator<VCEdge>_> *edges)

{
  _Rb_tree_header *__last;
  VCFace *pVVar1;
  pointer ppVVar2;
  VCCluster *this_00;
  _Base_ptr p_Var3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces_vec;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> faces;
  allocator_type local_79;
  VCFace *local_78 [3];
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  local_60;
  
  __last = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar10 = (this->opts).numCluster;
  iVar6 = (int)((ulong)((long)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4);
  uVar5 = (ulong)iVar6;
  if (uVar5 < uVar10) {
    (this->opts).numCluster = uVar5;
    uVar10 = uVar5;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  if (uVar10 != 0) {
LAB_00115a3a:
    do {
      iVar4 = rand();
      local_78[0] = (edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar4 % iVar6].f1;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &__last->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var8 = (_Rb_tree_header *)p_Var9;
          p_Var7 = p_Var3;
          pVVar1 = *(VCFace **)(p_Var7 + 1);
          p_Var9 = p_Var7;
          if (pVVar1 < local_78[0]) {
            p_Var9 = &p_Var8->_M_header;
          }
          p_Var3 = (&p_Var7->_M_left)[pVVar1 < local_78[0]];
        } while ((&p_Var7->_M_left)[pVVar1 < local_78[0]] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var9 != __last) {
          if (pVVar1 < local_78[0]) {
            p_Var7 = &p_Var8->_M_header;
          }
          if ((VCFace *)((_Rb_tree_header *)p_Var7)->_M_node_count <= local_78[0])
          goto LAB_00115a3a;
        }
      }
      std::
      _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>::
      _M_insert_unique<VCFace*const&>
                ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                  *)&local_60,local_78);
    } while (local_60._M_impl.super__Rb_tree_header._M_node_count < (this->opts).numCluster);
  }
  std::vector<VCFace*,std::allocator<VCFace*>>::vector<std::_Rb_tree_const_iterator<VCFace*>,void>
            ((vector<VCFace*,std::allocator<VCFace*>> *)local_78,
             (_Rb_tree_const_iterator<VCFace_*>)
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<VCFace_*>)__last,&local_79);
  for (uVar10 = 0; uVar10 < (this->opts).numCluster; uVar10 = uVar10 + 1) {
    ppVVar2 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    pVVar1 = (VCFace *)
             (local_78[0]->normal).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[uVar10 - 2];
    this_00 = ppVVar2[uVar10 + 1];
    VCCluster::delItem(*ppVVar2,pVVar1);
    VCCluster::addItem(this_00,pVVar1);
  }
  if (local_78[0] != (VCFace *)0x0) {
    operator_delete(local_78[0]);
  }
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VertexClustering::initClusters(vector<VCEdge>& edges) {
	int n = edges.size();
	set<VCFace*> faces;
	if (opts.numCluster > n)
		opts.numCluster = n;
	while (faces.size() < opts.numCluster) {
		while (true) {
			int r = rand() % n;
			VCFace* f = edges[r].f1;
			if (faces.find(f) == faces.end()) {
				faces.insert(f);
				break;
			}
		}
	}
	vector<VCFace*> faces_vec(faces.begin(), faces.end());
	for (int i = 0; i < opts.numCluster; ++i) {
		clusters[0]->giveItem(faces_vec[i], clusters[i + 1]);
	}
	
}